

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_buf_mgr.c
# Opt level: O3

void ihevc_buf_mgr_init(buf_mgr_t *ps_buf_mgr)

{
  ps_buf_mgr->u4_max_buf_cnt = 0x40;
  memset(&ps_buf_mgr->u4_active_buf_cnt,0,0x304);
  return;
}

Assistant:

void ihevc_buf_mgr_init(
                buf_mgr_t *ps_buf_mgr)
{
    WORD32 id;

    ps_buf_mgr->u4_max_buf_cnt = BUF_MGR_MAX_CNT;
    ps_buf_mgr->u4_active_buf_cnt = 0;

    for(id = 0; id < BUF_MGR_MAX_CNT; id++)
    {
        ps_buf_mgr->au4_status[id] = 0;
        ps_buf_mgr->apv_ptr[id] = NULL;
    }
}